

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

void __thiscall
Js::ProbeContainer::DispatchMutationBreakpoint
          (ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  code *pcVar1;
  InterpreterHaltState *pIVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  ScriptContext *pSVar7;
  undefined1 local_48 [16];
  ProbeContainer *local_38;
  undefined1 local_2c [8];
  int currentOffset;
  InterpreterHaltState *pHaltState_local;
  
  unique0x10000319 = pHaltState;
  if (pHaltState->stopType != STOP_MUTATIONBREAKPOINT) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x20d,"(pHaltState->stopType == STOP_MUTATIONBREAKPOINT)",
                                "pHaltState->stopType == STOP_MUTATIONBREAKPOINT");
    if (!bVar3) goto LAB_008c7acb;
    *puVar5 = 0;
  }
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchMutationBreakpoint: start: this=%p, pHaltState=%p\n",this,
                pHaltState);
  bVar3 = CanDispatchHalt(this,pHaltState);
  if (bVar3) {
    local_48._0_8_ = local_2c;
    local_2c._0_4_ = -1;
    local_48._8_8_ = local_2c + 4;
    local_38 = this;
    InitializeLocation(this,pHaltState,true);
    pIVar2 = stack0xffffffffffffffd8;
    bVar3 = InterpreterHaltState::IsValid(stack0xffffffffffffffd8);
    Output::Trace(DebuggerPhase,
                  L"ProbeContainer::DispatchMutationBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"
                  ,pIVar2,(ulong)bVar3);
    bVar3 = InterpreterHaltState::IsValid(stack0xffffffffffffffd8);
    if (bVar3) {
      iVar4 = (*stack0xffffffffffffffd8->topFrame->_vptr_DiagStackFrame[0xc])();
      if ((char)iVar4 != '\0') {
        local_2c._0_4_ = InterpreterHaltState::GetCurrentOffset(stack0xffffffffffffffd8);
        if ((int)local_2c._0_4_ < 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                      ,0x227,"(currentOffset > 0)","currentOffset > 0");
          if (!bVar3) goto LAB_008c7acb;
          *puVar5 = 0;
        }
        InterpreterHaltState::SetCurrentOffset(stack0xffffffffffffffd8,local_2c._0_4_ + -1);
      }
      StepController::Deactivate(&this->debugManager->stepController,stack0xffffffffffffffd8);
      AsyncBreakController::Deactivate(&this->debugManager->asyncBreakController);
      pFVar6 = InterpreterHaltState::GetFunction(stack0xffffffffffffffd8);
      FunctionBody::CheckAndRegisterFuncToDiag(pFVar6,this->pScriptContext);
      pFVar6 = InterpreterHaltState::GetFunction(stack0xffffffffffffffd8);
      pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)pFVar6);
      if (pSVar7 != this->pScriptContext) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                    ,0x22f,
                                    "(pHaltState->GetFunction()->GetScriptContext() == pScriptContext)"
                                    ,
                                    "pHaltState->GetFunction()->GetScriptContext() == pScriptContext"
                                   );
        if (!bVar3) {
LAB_008c7acb:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      (*this->haltCallbackProbe->_vptr_HaltCallback[1])
                (this->haltCallbackProbe,stack0xffffffffffffffd8);
    }
    anon_func::FinallyObject::~FinallyObject((FinallyObject *)local_48);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchMutationBreakpoint(InterpreterHaltState* pHaltState)
    {
        Assert(pHaltState->stopType == STOP_MUTATIONBREAKPOINT);

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchMutationBreakpoint: start: this=%p, pHaltState=%p\n"), this, pHaltState);
        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        // will store Current offset of the bytecode block.
        int currentOffset = -1;

        TryFinally([&]()
        {
            InitializeLocation(pHaltState);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchMutationBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                pHaltState, pHaltState->IsValid());

            if (pHaltState->IsValid())
            {
                // For interpreter frames, change the current location pointer of bytecode block, as it might be pointing to the next statement on the body.
                // In order to generated proper binding of mutation statement, the bytecode offset needed to be on the same span of the statement.
                // For native frames the offset is always current.
                // Move back a single byte to ensure that it falls under on the same statement.
                if (pHaltState->topFrame->IsInterpreterFrame())
                {
                    currentOffset = pHaltState->GetCurrentOffset();
                    Assert(currentOffset > 0);
                    pHaltState->SetCurrentOffset(currentOffset - 1);
                }
                debugManager->stepController.Deactivate(pHaltState);
                debugManager->asyncBreakController.Deactivate();

                pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                Assert(pHaltState->GetFunction()->GetScriptContext() == pScriptContext);

                haltCallbackProbe->DispatchHalt(pHaltState);
            }
        },
        [&](bool)
        {
            // Restore the current offset;
            if (currentOffset != -1 && pHaltState->topFrame->IsInterpreterFrame())
            {
                pHaltState->SetCurrentOffset(currentOffset);
            }
            DestroyLocation();
        });

    }